

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O1

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceImage::commandsBeforeCompute
          (MemoryQualifierInstanceImage *this,VkCommandBuffer cmdBuffer,
          VkDeviceSize bufferSizeInBytes)

{
  VkImageSubresourceRange subresourceRange;
  deUint32 dVar1;
  DeviceInterface *pDVar2;
  VkImageMemoryBarrier imageLayoutBarrier;
  
  pDVar2 = Context::getDeviceInterface
                     ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  dVar1 = getNumLayers((this->super_MemoryQualifierInstanceBase).m_imageType,
                       &(this->super_MemoryQualifierInstanceBase).m_imageSize);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = dVar1;
  makeImageMemoryBarrier
            (&imageLayoutBarrier,0,0x20,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)(((this->m_image).
                        super_UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>.
                        m_data.ptr)->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,subresourceRange);
  (*pDVar2->_vptr_DeviceInterface[0x6d])
            (pDVar2,cmdBuffer,0x4000,0x800,0,0,0,0,0,1,(int)&imageLayoutBarrier);
  return;
}

Assistant:

void MemoryQualifierInstanceImage::commandsBeforeCompute (const VkCommandBuffer cmdBuffer, const VkDeviceSize bufferSizeInBytes) const
{
	DE_UNREF(bufferSizeInBytes);

	const DeviceInterface&			deviceInterface	 = m_context.getDeviceInterface();
	const VkImageSubresourceRange	subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, getNumLayers(m_imageType, m_imageSize));

	const VkImageMemoryBarrier imageLayoutBarrier
		= makeImageMemoryBarrier(0u,
								 VK_ACCESS_SHADER_READ_BIT,
								 VK_IMAGE_LAYOUT_UNDEFINED,
								 VK_IMAGE_LAYOUT_GENERAL,
								 m_image->get(),
								 subresourceRange);

	deviceInterface.cmdPipelineBarrier(cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, 0u, 0u, DE_NULL, 0u, DE_NULL, 1u, &imageLayoutBarrier);
}